

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluObjectWrapper.cpp
# Opt level: O0

void __thiscall
glu::ObjectWrapper::ObjectWrapper(ObjectWrapper *this,Functions *gl,ObjectTraits *traits)

{
  char *pcVar1;
  GLenum value;
  ostream *poVar2;
  OutOfMemoryError *this_00;
  Error *this_01;
  Enum<int,_2UL> EVar3;
  string local_220;
  undefined1 local_1f9;
  string local_1f8;
  GetNameFunc local_1d8;
  int local_1d0;
  Enum<int,_2UL> local_1c8 [2];
  ostringstream local_1a8 [8];
  ostringstream msg;
  char *objectName;
  deUint32 err;
  ObjectTraits *traits_local;
  Functions *gl_local;
  ObjectWrapper *this_local;
  
  this->m_gl = gl;
  this->m_traits = traits;
  this->m_object = 0;
  (**(code **)((long)&gl->activeShaderProgram + traits->genFunc))(1,&this->m_object);
  if (this->m_object != 0) {
    return;
  }
  value = (*gl->getError)();
  pcVar1 = traits->name;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar2 = std::operator<<((ostream *)local_1a8,"Failed to create ");
  poVar2 = std::operator<<(poVar2,pcVar1);
  poVar2 = std::operator<<(poVar2," object, got ");
  EVar3 = getErrorStr(value);
  local_1d8 = EVar3.m_getName;
  local_1d0 = EVar3.m_value;
  local_1c8[0].m_getName = local_1d8;
  local_1c8[0].m_value = local_1d0;
  tcu::Format::operator<<(poVar2,local_1c8);
  if (value == 0x505) {
    local_1f9 = 1;
    this_00 = (OutOfMemoryError *)__cxa_allocate_exception(0x38);
    std::__cxx11::ostringstream::str();
    OutOfMemoryError::OutOfMemoryError(this_00,&local_1f8);
    local_1f9 = 0;
    __cxa_throw(this_00,&OutOfMemoryError::typeinfo,OutOfMemoryError::~OutOfMemoryError);
  }
  this_01 = (Error *)__cxa_allocate_exception(0x38);
  std::__cxx11::ostringstream::str();
  Error::Error(this_01,value,&local_220);
  __cxa_throw(this_01,&Error::typeinfo,Error::~Error);
}

Assistant:

ObjectWrapper::ObjectWrapper (const glw::Functions& gl, const ObjectTraits& traits)
	: m_gl		(gl)
	, m_traits	(traits)
	, m_object	(0)
{
	(gl.*traits.genFunc)(1, &m_object);

	if (m_object == 0)
	{
		const deUint32		err			= gl.getError();
		const char*			objectName	= traits.name;
		std::ostringstream	msg;

		msg << "Failed to create " << objectName << " object, got " << getErrorStr((int)err);

		if (err == GL_OUT_OF_MEMORY)
			throw OutOfMemoryError(msg.str());
		else
			throw Error((int)err, msg.str());
	}
}